

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entropy.c
# Opt level: O2

int mbedtls_entropy_func(void *data,uchar *output,size_t len)

{
  mbedtls_sha512_context *ctx;
  int iVar1;
  ulong uVar2;
  long lVar3;
  int iVar4;
  ulong uVar5;
  uchar buf [64];
  
  if (len < 0x41) {
    iVar4 = 0;
    do {
      iVar1 = -0x3c;
      if ((iVar4 == 0x101) ||
         (iVar1 = entropy_gather_internal((mbedtls_entropy_context *)data), iVar1 != 0))
      goto LAB_0010275c;
      iVar4 = iVar4 + 1;
      uVar5 = (ulong)*(uint *)((long)data + 0xe0);
      if ((int)*(uint *)((long)data + 0xe0) < 1) {
        uVar5 = 0;
      }
      uVar2 = 1;
      for (lVar3 = 0; uVar5 * 0x28 - lVar3 != 0; lVar3 = lVar3 + 0x28) {
        if (*(ulong *)((long)data + lVar3 + 0xf8) < *(ulong *)((long)data + lVar3 + 0x100)) {
          uVar2 = 0;
        }
      }
    } while ((int)uVar2 == 0);
    buf[0x30] = '\0';
    buf[0x31] = '\0';
    buf[0x32] = '\0';
    buf[0x33] = '\0';
    buf[0x34] = '\0';
    buf[0x35] = '\0';
    buf[0x36] = '\0';
    buf[0x37] = '\0';
    buf[0x38] = '\0';
    buf[0x39] = '\0';
    buf[0x3a] = '\0';
    buf[0x3b] = '\0';
    buf[0x3c] = '\0';
    buf[0x3d] = '\0';
    buf[0x3e] = '\0';
    buf[0x3f] = '\0';
    buf[0x20] = '\0';
    buf[0x21] = '\0';
    buf[0x22] = '\0';
    buf[0x23] = '\0';
    buf[0x24] = '\0';
    buf[0x25] = '\0';
    buf[0x26] = '\0';
    buf[0x27] = '\0';
    buf[0x28] = '\0';
    buf[0x29] = '\0';
    buf[0x2a] = '\0';
    buf[0x2b] = '\0';
    buf[0x2c] = '\0';
    buf[0x2d] = '\0';
    buf[0x2e] = '\0';
    buf[0x2f] = '\0';
    buf[0x10] = '\0';
    buf[0x11] = '\0';
    buf[0x12] = '\0';
    buf[0x13] = '\0';
    buf[0x14] = '\0';
    buf[0x15] = '\0';
    buf[0x16] = '\0';
    buf[0x17] = '\0';
    buf[0x18] = '\0';
    buf[0x19] = '\0';
    buf[0x1a] = '\0';
    buf[0x1b] = '\0';
    buf[0x1c] = '\0';
    buf[0x1d] = '\0';
    buf[0x1e] = '\0';
    buf[0x1f] = '\0';
    buf[0] = '\0';
    buf[1] = '\0';
    buf[2] = '\0';
    buf[3] = '\0';
    buf[4] = '\0';
    buf[5] = '\0';
    buf[6] = '\0';
    buf[7] = '\0';
    buf[8] = '\0';
    buf[9] = '\0';
    buf[10] = '\0';
    buf[0xb] = '\0';
    buf[0xc] = '\0';
    buf[0xd] = '\0';
    buf[0xe] = '\0';
    buf[0xf] = '\0';
    ctx = (mbedtls_sha512_context *)((long)data + 8);
    iVar1 = mbedtls_sha512_finish_ret(ctx,buf);
    if (iVar1 == 0) {
      mbedtls_sha512_free(ctx);
      mbedtls_sha512_init(ctx);
      iVar1 = mbedtls_sha512_starts_ret(ctx,0);
      if ((iVar1 == 0) && (iVar1 = mbedtls_sha512_update_ret(ctx,buf,0x40), iVar1 == 0)) {
        uVar5 = 0;
        iVar1 = mbedtls_sha512_ret(buf,0x40,buf,0);
        if (iVar1 == 0) {
          uVar2 = (ulong)*(uint *)((long)data + 0xe0);
          if ((int)*(uint *)((long)data + 0xe0) < 1) {
            uVar2 = uVar5;
          }
          for (; uVar2 * 0x28 - uVar5 != 0; uVar5 = uVar5 + 0x28) {
            *(undefined8 *)((long)data + uVar5 + 0xf8) = 0;
          }
          memcpy(output,buf,len);
          iVar1 = 0;
        }
      }
    }
LAB_0010275c:
    mbedtls_zeroize(buf,0x40);
  }
  else {
    iVar1 = -0x3c;
  }
  return iVar1;
}

Assistant:

int mbedtls_entropy_func( void *data, unsigned char *output, size_t len )
{
    int ret, count = 0, i, done;
    mbedtls_entropy_context *ctx = (mbedtls_entropy_context *) data;
    unsigned char buf[MBEDTLS_ENTROPY_BLOCK_SIZE];

    if( len > MBEDTLS_ENTROPY_BLOCK_SIZE )
        return( MBEDTLS_ERR_ENTROPY_SOURCE_FAILED );

#if defined(MBEDTLS_ENTROPY_NV_SEED)
    /* Update the NV entropy seed before generating any entropy for outside
     * use.
     */
    if( ctx->initial_entropy_run == 0 )
    {
        ctx->initial_entropy_run = 1;
        if( ( ret = mbedtls_entropy_update_nv_seed( ctx ) ) != 0 )
            return( ret );
    }
#endif

#if defined(MBEDTLS_THREADING_C)
    if( ( ret = mbedtls_mutex_lock( &ctx->mutex ) ) != 0 )
        return( ret );
#endif

    /*
     * Always gather extra entropy before a call
     */
    do
    {
        if( count++ > ENTROPY_MAX_LOOP )
        {
            ret = MBEDTLS_ERR_ENTROPY_SOURCE_FAILED;
            goto exit;
        }

        if( ( ret = entropy_gather_internal( ctx ) ) != 0 )
            goto exit;

        done = 1;
        for( i = 0; i < ctx->source_count; i++ )
            if( ctx->source[i].size < ctx->source[i].threshold )
                done = 0;
    }
    while( ! done );

    memset( buf, 0, MBEDTLS_ENTROPY_BLOCK_SIZE );

#if defined(MBEDTLS_ENTROPY_SHA512_ACCUMULATOR)
    /*
     * Note that at this stage it is assumed that the accumulator was started
     * in a previous call to entropy_update(). If this is not guaranteed, the
     * code below will fail.
     */
    if( ( ret = mbedtls_sha512_finish_ret( &ctx->accumulator, buf ) ) != 0 )
        goto exit;

    /*
     * Reset accumulator and counters and recycle existing entropy
     */
    mbedtls_sha512_free( &ctx->accumulator );
    mbedtls_sha512_init( &ctx->accumulator );
    if( ( ret = mbedtls_sha512_starts_ret( &ctx->accumulator, 0 ) ) != 0 )
        goto exit;
    if( ( ret = mbedtls_sha512_update_ret( &ctx->accumulator, buf,
                                           MBEDTLS_ENTROPY_BLOCK_SIZE ) ) != 0 )
        goto exit;

    /*
     * Perform second SHA-512 on entropy
     */
    if( ( ret = mbedtls_sha512_ret( buf, MBEDTLS_ENTROPY_BLOCK_SIZE,
                                    buf, 0 ) ) != 0 )
        goto exit;
#else /* MBEDTLS_ENTROPY_SHA512_ACCUMULATOR */
    if( ( ret = mbedtls_sha256_finish_ret( &ctx->accumulator, buf ) ) != 0 )
        goto exit;

    /*
     * Reset accumulator and counters and recycle existing entropy
     */
    mbedtls_sha256_free( &ctx->accumulator );
    mbedtls_sha256_init( &ctx->accumulator );
    if( ( ret = mbedtls_sha256_starts_ret( &ctx->accumulator, 0 ) ) != 0 )
        goto exit;
    if( ( ret = mbedtls_sha256_update_ret( &ctx->accumulator, buf,
                                           MBEDTLS_ENTROPY_BLOCK_SIZE ) ) != 0 )
        goto exit;

    /*
     * Perform second SHA-256 on entropy
     */
    if( ( ret = mbedtls_sha256_ret( buf, MBEDTLS_ENTROPY_BLOCK_SIZE,
                                    buf, 0 ) ) != 0 )
        goto exit;
#endif /* MBEDTLS_ENTROPY_SHA512_ACCUMULATOR */

    for( i = 0; i < ctx->source_count; i++ )
        ctx->source[i].size = 0;

    memcpy( output, buf, len );

    ret = 0;

exit:
    mbedtls_zeroize( buf, sizeof( buf ) );

#if defined(MBEDTLS_THREADING_C)
    if( mbedtls_mutex_unlock( &ctx->mutex ) != 0 )
        return( MBEDTLS_ERR_THREADING_MUTEX_ERROR );
#endif

    return( ret );
}